

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_queue_examples.cpp
# Opt level: O2

void density_tests::conc_heterogeneous_queue_put_transaction_samples(void)

{
  void *i_data;
  bool bVar1;
  int *piVar2;
  Msg *pMVar3;
  ostream *poVar4;
  runtime_type<> *prVar5;
  type_info *ptVar6;
  double *pdVar7;
  size_t i_len;
  size_t i_len_00;
  put_transaction<int> transaction1;
  type transaction2;
  int msg_2;
  put_transaction<void> transaction;
  int value_2;
  int msg_1;
  undefined1 local_128 [16];
  put_transaction<void> local_118;
  undefined1 local_f8 [8];
  undefined1 auStack_f0 [16];
  ControlBlock *pCStack_e0;
  void *pvStack_d8;
  double local_d0;
  __native_type local_c8;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_a0;
  int local_8c;
  undefined1 local_88 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phStack_80;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *local_78;
  ControlBlock *pCStack_70;
  void *pvStack_68;
  put_transaction<int> local_58;
  
  local_c8.__align = 0;
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  local_c8._16_8_ = 0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)&local_c8.__data);
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  local_88._0_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_f8,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_c8.__data,(int *)local_88);
  local_128._0_8_ = local_f8;
  local_128[8] = auStack_f0[0];
  local_f8 = (undefined1  [8])0x0;
  auStack_f0._0_8_ = auStack_f0._0_8_ & 0xffffffffffffff00;
  local_118.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       auStack_f0._8_8_;
  local_118.m_put_data.m_control_block = pCStack_e0;
  local_118.m_put_data.m_user_storage = pvStack_d8;
  auStack_f0._8_8_ =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_f8);
  local_f8 = (undefined1  [8])local_128._0_8_;
  auStack_f0[0] = (bool)local_128[8];
  local_128._0_8_ =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_128[8] = false;
  auStack_f0._8_8_ = local_118.m_queue;
  pCStack_e0 = local_118.m_put_data.m_control_block;
  pvStack_d8 = local_118.m_put_data.m_user_storage;
  local_118.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  piVar2 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  put_transaction<int>::element_ptr((put_transaction<int> *)(auStack_f0 + 8));
  if (*piVar2 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x9e,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)local_f8);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      auStack_f0._8_8_ !=
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xa2,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_f8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_128);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  local_88._0_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_f8,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_c8.__data,(int *)local_88);
  local_128._0_8_ = local_f8;
  local_128[8] = auStack_f0[0];
  local_f8 = (undefined1  [8])0x0;
  auStack_f0[0] = false;
  local_118.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       auStack_f0._8_8_;
  local_118.m_put_data.m_control_block = pCStack_e0;
  local_118.m_put_data.m_user_storage = pvStack_d8;
  auStack_f0._8_8_ =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_f8);
  local_f8 = (undefined1  [8])0x0;
  auStack_f0._0_8_ = (ulong)(uint7)auStack_f0._1_7_ << 8;
  auStack_f0._8_8_ =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=
            ((put_transaction<void> *)local_f8,(put_transaction<int> *)local_128);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_118.m_queue !=
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xcc,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::commit((put_transaction<void> *)local_f8);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      auStack_f0._8_8_ !=
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0xce,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_f8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_128);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  local_f8 = (undefined1  [8])&local_c8;
  std::chrono::_V2::system_clock::now();
  local_88._0_4_ = 0x2a;
  local_d0 = (double)CONCAT44(local_d0._4_4_,0x237);
  conc_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)local_f8,local_88,i_len);
  conc_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)local_f8,&local_d0,i_len_00);
  while( true ) {
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    try_start_consume((consume_operation *)local_128,
                      (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&local_c8.__data);
    if (local_118.m_put_data.m_control_block == (ControlBlock *)0x0) break;
    pMVar3 = density::
             conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
             consume_operation::
             element<density_tests::conc_heterogeneous_queue_put_transaction_samples()::Msg>
                       ((consume_operation *)local_128);
    i_data = pMVar3->m_data;
    pMVar3 = density::
             conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
             consume_operation::
             element<density_tests::conc_heterogeneous_queue_put_transaction_samples()::Msg>
                       ((consume_operation *)local_128);
    compute_checksum(i_data,pMVar3->m_len);
    poVar4 = std::operator<<((ostream *)&std::cout,"Message with checksum ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," at ");
    density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    consume_operation::
    element<density_tests::conc_heterogeneous_queue_put_transaction_samples()::Msg>
              ((consume_operation *)local_128);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)local_128);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)local_128);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_128);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_128._0_8_ =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_118.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  local_88._0_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_f8,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_c8.__data,(int *)local_88);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=
            ((put_transaction<void> *)local_128,(put_transaction<int> *)local_f8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_f8);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_118.m_queue ==
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x145,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_128);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_128._0_8_ =
       (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_118.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  local_88._0_4_ = 1;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_f8,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_c8.__data,(int *)local_88);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<void>::operator=
            ((put_transaction<void> *)local_128,(put_transaction<int> *)local_f8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_f8);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_118.m_queue ==
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x14f,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_128);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_c8.__data);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x157,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  local_88._0_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_f8,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_c8.__data,(int *)local_88);
  local_128._0_8_ = local_f8;
  local_128[8] = auStack_f0[0];
  local_f8 = (undefined1  [8])0x0;
  auStack_f0._0_8_ = auStack_f0._0_8_ & 0xffffffffffffff00;
  local_118.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       auStack_f0._8_8_;
  local_118.m_put_data.m_control_block = pCStack_e0;
  local_118.m_put_data.m_user_storage = pvStack_d8;
  auStack_f0._8_8_ =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_f8);
  if ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_118.m_queue ==
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x15b,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::cancel((put_transaction<int> *)local_128);
  bVar1 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_c8.__data);
  if ((!bVar1) ||
     ((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      local_118.m_queue !=
      (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
      0x0)) {
    __assert_fail("queue.empty() && put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x15d,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  local_88._0_4_ = 0x2a;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_push<int>((put_transaction<int> *)local_f8,
                  (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_c8.__data,(int *)local_88);
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<int>::operator=
            ((put_transaction<int> *)local_128,(put_transaction<int> *)local_f8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_f8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::commit((put_transaction<int> *)local_128);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((consume_operation *)local_f8,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_c8.__data);
  piVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::element<int>((consume_operation *)(auStack_f0 + 8));
  if (*piVar2 != 0x2a) {
    __assert_fail("queue.try_start_consume().element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x162,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_f8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<int>::~put_transaction((put_transaction<int> *)local_128);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a0.m_head = (ControlBlock *)0xffef;
  local_a0.m_tail = (ControlBlock *)0xffef;
  local_d0._0_4_ = 0x2a;
  local_88 = (undefined1  [8])
             density::detail::
             FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
             ::s_table;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_dyn_push_copy((put_transaction<void> *)local_f8,
                      (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&local_c8.__data,(runtime_type *)local_88,&local_d0);
  local_128._0_8_ = local_f8;
  local_128[8] = auStack_f0[0];
  local_f8 = (undefined1  [8])0x0;
  auStack_f0._0_8_ = auStack_f0._0_8_ & 0xffffffffffffff00;
  local_118.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       auStack_f0._8_8_;
  local_118.m_put_data.m_control_block = pCStack_e0;
  local_118.m_put_data.m_user_storage = pvStack_d8;
  auStack_f0._8_8_ =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<void>::~put_transaction((put_transaction<void> *)local_f8);
  piVar2 = (int *)density::
                  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                  ::put_transaction<void>::element_ptr((put_transaction<void> *)local_128);
  if (*piVar2 == 0x2a) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Putting an ");
    prVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             put_transaction<void>::complete_type(&local_118);
    ptVar6 = density::runtime_type<>::type_info(prVar5);
    poVar4 = std::operator<<(poVar4,*(char **)(ptVar6 + 8) + (**(char **)(ptVar6 + 8) == '*'));
    poVar4 = std::operator<<(poVar4,"...");
    std::endl<char,std::char_traits<char>>(poVar4);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<void>::commit((put_transaction<void> *)local_128);
    local_8c = 1;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_push<int>((put_transaction<int> *)local_88,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_c8.__data,&local_8c);
    local_f8 = local_88;
    auStack_f0[0] = phStack_80._0_1_;
    local_88 = (undefined1  [8])0x0;
    phStack_80 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )((ulong)phStack_80 & 0xffffffffffffff00);
    auStack_f0._8_8_ = local_78;
    pCStack_e0 = pCStack_70;
    pvStack_d8 = pvStack_68;
    local_78 = (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                *)0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<int>::~put_transaction((put_transaction<int> *)local_88);
    piVar2 = (int *)density::
                    conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::put_transaction<int>::element_ptr((put_transaction<int> *)local_f8);
    if (*piVar2 != 1) {
      __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                    ,0x172,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()")
      ;
    }
    piVar2 = (int *)density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::put_transaction<int>::element_ptr((put_transaction<int> *)(auStack_f0 + 8));
    if (*piVar2 != 1) {
      __assert_fail("put_1.element() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                    ,0x173,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()")
      ;
    }
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<int>::commit((put_transaction<int> *)local_f8);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<int>::~put_transaction((put_transaction<int> *)local_f8);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<void>::~put_transaction((put_transaction<void> *)local_128);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy(&local_a0);
    local_c8._16_8_ = 0;
    local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_c8.__align = 0;
    local_c8._8_8_ = 0;
    local_a0.m_head = (ControlBlock *)0xffef;
    local_a0.m_tail = (ControlBlock *)0xffef;
    local_d0 = (double)CONCAT44(local_d0._4_4_,0x2a);
    local_88 = (undefined1  [8])
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_dyn_push_copy((put_transaction<void> *)local_f8,
                        (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)&local_c8.__data,(runtime_type *)local_88,&local_d0);
    local_128._0_8_ = local_f8;
    local_128[8] = auStack_f0[0];
    local_f8 = (undefined1  [8])0x0;
    auStack_f0._0_8_ = (ulong)(uint7)auStack_f0._1_7_ << 8;
    local_118.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         auStack_f0._8_8_;
    local_118.m_put_data.m_control_block = pCStack_e0;
    local_118.m_put_data.m_user_storage = pvStack_d8;
    auStack_f0._8_8_ =
         (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<void>::~put_transaction((put_transaction<void> *)local_f8);
    prVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             put_transaction<void>::complete_type(&local_118);
    if (prVar5->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) {
      __assert_fail("put.complete_type().is<int>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                    ,0x17c,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()")
      ;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Putting an ");
    prVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             put_transaction<void>::complete_type(&local_118);
    ptVar6 = density::runtime_type<>::type_info(prVar5);
    poVar4 = std::operator<<(poVar4,*(char **)(ptVar6 + 8) + (**(char **)(ptVar6 + 8) == '*'));
    poVar4 = std::operator<<(poVar4,"...");
    std::endl<char,std::char_traits<char>>(poVar4);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<void>::~put_transaction((put_transaction<void> *)local_128);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy(&local_a0);
    local_c8._16_8_ = 0;
    local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_c8.__align = 0;
    local_c8._8_8_ = 0;
    local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_a0.m_head = (ControlBlock *)0xffef;
    local_a0.m_tail = (ControlBlock *)0xffef;
    local_128._0_4_ = 0x2a;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_push<int>(&local_58,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_c8.__data,(int *)local_128);
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    put_transaction<int>::~put_transaction(&local_58);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy(&local_a0);
    local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_c8._16_8_ = 0;
    local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_c8.__align = 0;
    local_c8._8_8_ = 0;
    local_a0.m_head = (ControlBlock *)0xffef;
    local_a0.m_tail = (ControlBlock *)0xffef;
    local_8c = 0x2a;
    local_88 = (undefined1  [8])
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)local_f8,
               (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                *)&local_c8.__data,(runtime_type *)local_88,&local_8c);
    local_128._0_8_ = local_f8;
    local_128._8_8_ = auStack_f0._0_8_;
    local_118.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         auStack_f0._8_8_;
    local_118.m_put_data.m_control_block = pCStack_e0;
    local_f8 = (undefined1  [8])0x0;
    auStack_f0._0_8_ =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)local_f8);
    local_d0 = 42.0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_push<double>
              ((reentrant_put_transaction<double> *)local_88,
               (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                *)&local_c8.__data,&local_d0);
    local_f8 = local_88;
    auStack_f0._0_8_ = phStack_80;
    auStack_f0._8_8_ = local_78;
    pCStack_e0 = pCStack_70;
    local_88 = (undefined1  [8])0x0;
    phStack_80 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0;
    density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<double>::~reentrant_put_transaction
              ((reentrant_put_transaction<double> *)local_88);
    pdVar7 = (double *)
             density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             reentrant_put_transaction<double>::element_ptr
                       ((reentrant_put_transaction<double> *)auStack_f0);
    if ((*pdVar7 == 42.0) && (!NAN(*pdVar7))) {
      density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
      ::reentrant_put_transaction<double>::~reentrant_put_transaction
                ((reentrant_put_transaction<double> *)local_f8);
      density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
      ::reentrant_put_transaction<void>::~reentrant_put_transaction
                ((reentrant_put_transaction<void> *)local_128);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_a0);
      return;
    }
    __assert_fail("typed_put.element() == 42.",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                  ,0x195,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
  }
  __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_queue_examples.cpp"
                ,0x16a,"void density_tests::conc_heterogeneous_queue_put_transaction_samples()");
}

Assistant:

void conc_heterogeneous_queue_put_transaction_samples()
    {
        using namespace density;
        {
            //! [conc_heter_queue put_transaction default_construct example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(transaction.empty());
            //! [conc_heter_queue put_transaction default_construct example 1]
        }
        {
            //! [conc_heter_queue put_transaction copy_construct example 1]
            static_assert(
              !std::is_copy_constructible<conc_heter_queue<>::put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_constructible<conc_heter_queue<int>::put_transaction<>>::value, "");
            //! [conc_heter_queue put_transaction copy_construct example 1]
        }
        {
            //! [conc_heter_queue put_transaction copy_assign example 1]
            static_assert(
              !std::is_copy_assignable<conc_heter_queue<>::put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_assignable<conc_heter_queue<int>::put_transaction<>>::value, "");
            //! [conc_heter_queue put_transaction copy_assign example 1]
        }
        {
            //! [conc_heter_queue put_transaction move_construct example 1]
            conc_heter_queue<> queue;
            auto               transaction1 = queue.start_push(1);

            // move from transaction1 to transaction2
            auto transaction2(std::move(transaction1));
            assert(transaction1.empty());
            assert(transaction2.element() == 1);

            // commit transaction2
            transaction2.commit();
            assert(transaction2.empty());

            //! [conc_heter_queue put_transaction move_construct example 1]

            //! [conc_heter_queue put_transaction move_construct example 2]
            // put_transaction<void> can be move constructed from any put_transaction<T>
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");

            // put_transaction<T> can be move constructed only from put_transaction<T>
            static_assert(
              !std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");
            //! [conc_heter_queue put_transaction move_construct example 2]
        }
        {
            //! [conc_heter_queue put_transaction move_assign example 1]
            conc_heter_queue<> queue;
            auto               transaction1 = queue.start_push(1);

            conc_heter_queue<>::put_transaction<> transaction2;
            transaction2 = std::move(transaction1);
            assert(transaction1.empty());
            transaction2.commit();
            assert(transaction2.empty());
            //! [conc_heter_queue put_transaction move_assign example 1]

            //! [conc_heter_queue put_transaction move_assign example 2]
            // put_transaction<void> can be move assigned from any put_transaction<T>
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<void>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");

            // put_transaction<T> can be move assigned only from put_transaction<T>
            static_assert(
              !std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                conc_heter_queue<>::put_transaction<int>,
                conc_heter_queue<>::put_transaction<int> &&>::value,
              "");
            //! [conc_heter_queue put_transaction move_assign example 2]
        }
        {
            //! [conc_heter_queue put_transaction raw_allocate example 1]
            conc_heter_queue<> queue;
            struct Msg
            {
                std::chrono::high_resolution_clock::time_point m_time =
                  std::chrono::high_resolution_clock::now();
                size_t m_len  = 0;
                void * m_data = nullptr;
            };

            auto post_message = [&queue](const void * i_data, size_t i_len) {
                auto transaction             = queue.start_emplace<Msg>();
                transaction.element().m_len  = i_len;
                transaction.element().m_data = transaction.raw_allocate(i_len, 1);
                memcpy(transaction.element().m_data, i_data, i_len);

                assert(
                  !transaction
                     .empty()); // a put transaction is not empty if it's bound to an element being put
                transaction.commit();
                assert(transaction.empty()); // the commit makes the transaction empty
            };

            auto const start_time = std::chrono::high_resolution_clock::now();

            auto consume_all_msgs = [&queue, &start_time] {
                while (auto consume = queue.try_start_consume())
                {
                    auto const checksum =
                      compute_checksum(consume.element<Msg>().m_data, consume.element<Msg>().m_len);
                    std::cout << "Message with checksum " << checksum << " at ";
                    std::cout << (consume.element<Msg>().m_time - start_time).count() << std::endl;
                    consume.commit();
                }
            };

            int msg_1 = 42, msg_2 = 567;
            post_message(&msg_1, sizeof(msg_1));
            post_message(&msg_2, sizeof(msg_2));

            consume_all_msgs();
            //! [conc_heter_queue put_transaction raw_allocate example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction raw_allocate_copy example 1]
            struct Msg
            {
                size_t m_len   = 0;
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const char * i_data, size_t i_len) {
                auto transaction            = queue.start_emplace<Msg>();
                transaction.element().m_len = i_len;
                transaction.element().m_chars =
                  transaction.raw_allocate_copy(i_data, i_data + i_len);
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            };
            //! [conc_heter_queue put_transaction raw_allocate_copy example 1]
            (void)post_message;
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction raw_allocate_copy example 2]
            struct Msg
            {
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const std::string & i_string) {
                auto transaction              = queue.start_emplace<Msg>();
                transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
                transaction.commit();
            };
            //! [conc_heter_queue put_transaction raw_allocate_copy example 2]
            (void)post_message;
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction empty example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(transaction.empty());

            transaction = queue.start_push(1);
            assert(!transaction.empty());
            //! [conc_heter_queue put_transaction empty example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction operator_bool example 1]
            conc_heter_queue<>::put_transaction<> transaction;
            assert(!transaction);

            transaction = queue.start_push(1);
            assert(transaction);
            //! [conc_heter_queue put_transaction operator_bool example 1]
        }
        {
            //! [conc_heter_queue put_transaction cancel example 1]
            conc_heter_queue<> queue;

            // start and cancel a put
            assert(queue.empty());
            auto put = queue.start_push(42);
            /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
        the queue during a non-reentrant put transaction. */
            assert(!put.empty());
            put.cancel();
            assert(queue.empty() && put.empty());

            // start and commit a put
            put = queue.start_push(42);
            put.commit();
            assert(queue.try_start_consume().element<int>() == 42);
            //! [conc_heter_queue put_transaction cancel example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction element_ptr example 1]
            int  value = 42;
            auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(*static_cast<int *>(put.element_ptr()) == 42);
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            put.commit();
            //! [conc_heter_queue put_transaction element_ptr example 1]

            //! [conc_heter_queue put_transaction element_ptr example 2]
            auto put_1 = queue.start_push(1);
            assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
            assert(put_1.element() == 1);                          // this is better
            put_1.commit();
            //! [conc_heter_queue put_transaction element_ptr example 2]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction complete_type example 1]
            int  value = 42;
            auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(put.complete_type().is<int>());
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            //! [conc_heter_queue put_transaction complete_type example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue put_transaction destroy example 1]
            queue.start_push(42); /* this transaction is destroyed without being committed,
                            so it gets canceled automatically. */
            //! [conc_heter_queue put_transaction destroy example 1]
        }
        {
            conc_heter_queue<> queue;
            //! [conc_heter_queue typed_put_transaction element example 1]

            int  value = 42;
            auto untyped_put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

            auto typed_put = queue.start_reentrant_push(42.);

            /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
        transaction to a typed transaction */

            assert(typed_put.element() == 42.);

            //! [conc_heter_queue typed_put_transaction element example 1]
        }
    }